

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_cmov(secp256k1_fe *r,secp256k1_fe *a,int flag)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  secp256k1_fe *psVar18;
  int64_t iVar19;
  uint64_t *puVar20;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  ulong uVar21;
  long lVar22;
  ulong uVar23;
  ulong uVar24;
  secp256k1_modinv64_modinfo *psVar25;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  ulong *extraout_RDX_02;
  uint64_t uVar26;
  long extraout_RDX_03;
  long extraout_RDX_04;
  long extraout_RDX_05;
  long extraout_RDX_06;
  long extraout_RDX_07;
  long extraout_RDX_08;
  long extraout_RDX_09;
  secp256k1_modinv64_signed62 *a_00;
  secp256k1_fe *psVar27;
  ulong uVar28;
  secp256k1_fe *psVar29;
  secp256k1_fe *psVar30;
  secp256k1_modinv64_signed62 *psVar31;
  secp256k1_fe *psVar32;
  secp256k1_fe *psVar33;
  secp256k1_modinv64_signed62 *a_01;
  long lVar34;
  uint64_t *puVar35;
  long lVar36;
  ulong uVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  uint64_t *puVar41;
  secp256k1_modinv64_modinfo *psVar42;
  secp256k1_fe *psVar43;
  secp256k1_fe *psVar44;
  ulong uVar45;
  bool bVar46;
  int vflag;
  unsigned_long _zzq_result;
  unsigned_long _zzq_args [6];
  secp256k1_modinv64_signed62 sStack_388;
  secp256k1_modinv64_signed62 sStack_360;
  secp256k1_fe *psStack_338;
  secp256k1_fe *psStack_330;
  secp256k1_fe *psStack_328;
  ulong uStack_320;
  secp256k1_fe *psStack_318;
  ulong uStack_310;
  secp256k1_fe *psStack_308;
  secp256k1_fe *psStack_300;
  secp256k1_fe *psStack_2f8;
  uint64_t uStack_2f0;
  uint64_t uStack_2e8;
  secp256k1_fe *psStack_2e0;
  secp256k1_fe *psStack_2d8;
  uint64_t uStack_2d0;
  uint64_t uStack_2c8;
  secp256k1_fe *psStack_2c0;
  secp256k1_fe *psStack_2b8;
  uint64_t uStack_2b0;
  secp256k1_fe *psStack_2a8;
  ulong uStack_2a0;
  secp256k1_modinv64_modinfo *psStack_298;
  ulong uStack_290;
  secp256k1_fe *psStack_288;
  code *pcStack_280;
  code *pcStack_278;
  secp256k1_fe *psStack_268;
  ulong uStack_260;
  secp256k1_fe *psStack_258;
  ulong uStack_250;
  secp256k1_fe *psStack_248;
  ulong uStack_240;
  int iStack_234;
  ulong uStack_230;
  ulong uStack_228;
  ulong uStack_220;
  ulong uStack_218;
  long lStack_210;
  long lStack_208;
  secp256k1_fe sStack_200;
  long lStack_1d0;
  secp256k1_fe *psStack_1c8;
  ulong uStack_1c0;
  ulong uStack_1b8;
  secp256k1_fe *psStack_1b0;
  ulong uStack_1a8;
  ulong uStack_1a0;
  secp256k1_fe *psStack_198;
  secp256k1_fe sStack_190;
  secp256k1_fe sStack_160;
  secp256k1_modinv64_trans2x2 sStack_130;
  undefined1 auStack_110 [48];
  undefined8 uStack_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  secp256k1_fe sStack_c0;
  
  if ((uint)flag < 2) {
    secp256k1_fe_verify(a);
    secp256k1_fe_verify(r);
    uVar21 = (long)flag - 1;
    uVar16 = -(long)flag;
    r->n[0] = a->n[0] & uVar16 | r->n[0] & uVar21;
    r->n[1] = a->n[1] & uVar16 | r->n[1] & uVar21;
    r->n[2] = a->n[2] & uVar16 | r->n[2] & uVar21;
    r->n[3] = a->n[3] & uVar16 | r->n[3] & uVar21;
    r->n[4] = uVar16 & a->n[4] | uVar21 & r->n[4];
    if (r->magnitude < a->magnitude) {
      r->magnitude = a->magnitude;
    }
    if (a->normalized == 0) {
      r->normalized = 0;
    }
    secp256k1_fe_verify(r);
    return;
  }
  secp256k1_fe_cmov_cold_1();
  uStack_230 = 0;
  pcStack_278 = (code *)0x117918;
  psStack_1b0 = r;
  secp256k1_fe_verify(a);
  lStack_1d0 = 0x1000003d1;
  uVar21 = (a->n[4] >> 0x30) * 0x1000003d1 + a->n[0];
  uVar28 = (uVar21 >> 0x34) + a->n[1];
  uVar16 = (uVar28 >> 0x34) + a->n[2];
  uVar23 = (uVar16 >> 0x34) + a->n[3];
  uVar24 = (uVar23 >> 0x34) + (a->n[4] & 0xffffffffffff);
  uStack_1b8 = (uVar28 | uVar21 | uVar16 | uVar23) & 0xfffffffffffff | uVar24;
  uStack_1c0 = (uVar21 ^ 0x1000003d0) & uVar28 & uVar16 & uVar23 & (uVar24 ^ 0xf000000000000);
  pcStack_278 = (code *)0x11799b;
  secp256k1_fe_verify(a);
  sStack_c0.n[0] = a->n[0];
  sStack_c0.n[1] = a->n[1];
  sStack_c0.n[2] = a->n[2];
  sStack_c0.n[3] = a->n[3];
  sStack_c0.n[4] = a->n[4];
  sStack_c0.magnitude = a->magnitude;
  sStack_c0.normalized = a->normalized;
  pcStack_278 = (code *)0x1179cd;
  psStack_1c8 = a;
  secp256k1_fe_normalize(&sStack_c0);
  sStack_190.n[0] = (sStack_c0.n[1] << 0x34 | sStack_c0.n[0]) & 0x3fffffffffffffff;
  uStack_260 = (ulong)((uint)sStack_c0.n[2] & 0xfffff) << 0x2a | sStack_c0.n[1] >> 10;
  uStack_250 = (ulong)((uint)sStack_c0.n[3] & 0x3fffffff) << 0x20 | sStack_c0.n[2] >> 0x14;
  uStack_228 = (sStack_c0.n[4] & 0xffffffffff) << 0x16 | sStack_c0.n[3] >> 0x1e;
  sStack_190.n[4] = sStack_c0.n[4] >> 0x28;
  auStack_110._16_8_ = 0;
  auStack_110._24_8_ = 0;
  auStack_110._0_8_ = 0;
  auStack_110._8_8_ = 0;
  auStack_110._32_8_ = (secp256k1_fe *)0x0;
  uStack_d0 = 0;
  uStack_c8 = 0;
  uStack_e0 = 0;
  uStack_d8 = 0;
  auStack_110._40_4_ = 1;
  auStack_110._44_4_ = 0;
  sStack_200.n[2] = 0;
  sStack_200.n[3] = 0;
  sStack_200.n[0] = -0x1000003d1;
  sStack_200.n[1] = 0;
  sStack_200.n[4] = 0x100;
  psVar32 = &sStack_160;
  uVar23 = 0x100;
  uStack_220 = 0;
  uStack_240 = 0;
  uVar24 = 0xffffffffffffffff;
  iVar14 = 0;
  uVar21 = sStack_190.n[0];
  uVar16 = 0x1000003d0;
  psVar44 = (secp256k1_fe *)0xfffffffefffffc2f;
  psStack_248 = (secp256k1_fe *)sStack_190.n[4];
  sStack_190.n[1] = uStack_260;
  sStack_190.n[2] = uStack_250;
  sStack_190.n[3] = uStack_228;
  sStack_160.n[0] = sStack_190.n[0];
  sStack_160.n[1] = uStack_260;
  sStack_160.n[2] = uStack_250;
  sStack_160.n[3] = uStack_228;
  sStack_160.n[4] = sStack_190.n[4];
  do {
    uVar28 = 8;
    lVar22 = 3;
    psVar42 = (secp256k1_modinv64_modinfo *)0x0;
    psVar27 = (secp256k1_fe *)0x0;
    psVar29 = (secp256k1_fe *)0x8;
    psStack_268 = (secp256k1_fe *)0x8;
    uVar17 = uVar21;
    psVar18 = psVar44;
    psVar33 = psVar32;
    do {
      uStack_1a8 = uVar23;
      if (((ulong)psVar18 & 1) == 0) {
        pcStack_278 = (code *)0x118402;
        secp256k1_fe_inv_cold_22();
        psVar32 = psVar33;
LAB_00118402:
        pcStack_278 = (code *)0x118407;
        secp256k1_fe_inv_cold_1();
LAB_00118407:
        pcStack_278 = (code *)0x11840c;
        secp256k1_fe_inv_cold_2();
LAB_0011840c:
        pcStack_278 = (code *)0x118411;
        secp256k1_fe_inv_cold_21();
        goto LAB_00118411;
      }
      psVar32 = (secp256k1_fe *)((long)psVar42 * uVar21 + uVar28 * (long)psVar44);
      psVar29 = (secp256k1_fe *)((long)psVar18 << ((byte)lVar22 & 0x3f));
      if (psVar32 != psVar29) goto LAB_00118402;
      psVar32 = (secp256k1_fe *)((long)psStack_268 * uVar21 + (long)psVar27 * (long)psVar44);
      psVar29 = (secp256k1_fe *)(uVar17 << ((byte)lVar22 & 0x3f));
      if (psVar32 != psVar29) goto LAB_00118407;
      psVar29 = (secp256k1_fe *)((long)uVar24 >> 0x3f);
      uStack_1a0 = (ulong)((uint)uVar17 & 1);
      uVar37 = -uStack_1a0;
      psVar33 = (secp256k1_fe *)((ulong)psVar29 & uVar37);
      uVar24 = uVar24 ^ (ulong)psVar33;
      psVar32 = psVar33;
      uVar16 = uVar21;
      psStack_198 = psVar29;
      if (uVar24 - 0x251 < 0xfffffffffffffb61) goto LAB_0011840c;
      uVar24 = uVar24 - 1;
      psVar32 = (secp256k1_fe *)
                ((long)psStack_268->n + (((ulong)psVar29 ^ (ulong)psVar42) - (long)psVar29 & uVar37)
                );
      psVar42 = (secp256k1_modinv64_modinfo *)
                (((long)(psVar42->modulus).v + ((ulong)psVar32 & (ulong)psVar33)) * 2);
      psVar27 = (secp256k1_fe *)
                ((long)psVar27->n + (((ulong)psVar29 ^ uVar28) - (long)psVar29 & uVar37));
      uVar28 = (uVar28 + ((ulong)psVar27 & (ulong)psVar33)) * 2;
      uVar37 = (((ulong)psVar29 ^ (ulong)psVar18) - (long)psVar29 & uVar37) + uVar17;
      uVar17 = uVar37 >> 1;
      psVar18 = (secp256k1_fe *)((long)psVar18->n + (uVar37 & (ulong)psVar33));
      lVar22 = lVar22 + 1;
      psStack_268 = psVar32;
    } while (lVar22 != 0x3e);
    psVar29 = (secp256k1_fe *)((long)psVar42 * (long)psVar27);
    psVar25 = SUB168(SEXT816((long)psVar42) * SEXT816((long)psVar27),8);
    psVar18 = psVar44;
    psStack_258 = psVar44;
    iStack_234 = iVar14;
    sStack_130.u = uVar28;
    sStack_130.v = (int64_t)psVar42;
    sStack_130.q = (int64_t)psVar27;
    sStack_130.r = (int64_t)psVar32;
    if ((SUB168(SEXT816((long)uVar28) * SEXT816((long)psVar32),8) - (long)psVar25) -
        (ulong)((secp256k1_fe *)(uVar28 * (long)psVar32) < psVar29) != 2 ||
        (long)(uVar28 * (long)psVar32) - (long)psVar29 != 0) goto LAB_00118466;
    pcStack_278 = (code *)0x117cb9;
    secp256k1_modinv64_update_de_62
              ((secp256k1_modinv64_signed62 *)auStack_110,
               (secp256k1_modinv64_signed62 *)(auStack_110 + 0x28),&sStack_130,psVar25);
    psVar44 = &sStack_200;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x117cd9;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,-1);
    if (iVar14 < 1) {
LAB_00118411:
      pcStack_278 = (code *)0x118416;
      secp256k1_fe_inv_cold_20();
LAB_00118416:
      pcStack_278 = (code *)0x11841b;
      secp256k1_fe_inv_cold_19();
LAB_0011841b:
      pcStack_278 = (code *)0x118420;
      secp256k1_fe_inv_cold_18();
LAB_00118420:
      pcStack_278 = (code *)0x118425;
      secp256k1_fe_inv_cold_17();
LAB_00118425:
      pcStack_278 = (code *)0x11842a;
      secp256k1_fe_inv_cold_4();
      uVar23 = uVar16;
LAB_0011842a:
      pcStack_278 = (code *)0x11842f;
      secp256k1_fe_inv_cold_5();
LAB_0011842f:
      pcStack_278 = (code *)0x118434;
      secp256k1_fe_inv_cold_16();
LAB_00118434:
      pcStack_278 = (code *)0x118439;
      secp256k1_fe_inv_cold_15();
LAB_00118439:
      pcStack_278 = (code *)0x11843e;
      secp256k1_fe_inv_cold_14();
LAB_0011843e:
      pcStack_278 = (code *)0x118443;
      secp256k1_fe_inv_cold_13();
LAB_00118443:
      pcStack_278 = (code *)0x118448;
      secp256k1_fe_inv_cold_12();
LAB_00118448:
      pcStack_278 = (code *)0x11844d;
      secp256k1_fe_inv_cold_11();
LAB_0011844d:
      pcStack_278 = (code *)0x118452;
      secp256k1_fe_inv_cold_10();
LAB_00118452:
      psVar18 = psVar44;
      pcStack_278 = (code *)0x118457;
      secp256k1_fe_inv_cold_9();
      goto LAB_00118457;
    }
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x117cfa;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (0 < iVar14) goto LAB_00118416;
    psVar44 = &sStack_160;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x117d25;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,-1);
    if (iVar14 < 1) goto LAB_0011841b;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x117d46;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (-1 < iVar14) goto LAB_00118420;
    uVar17 = uVar28 * (long)psStack_258 + (long)psVar42 * uVar21;
    lVar34 = SUB168(SEXT816((long)uVar28) * SEXT816((long)psStack_258),8) +
             SUB168(SEXT816((long)psVar42) * SEXT816((long)uVar21),8) +
             (ulong)CARRY8(uVar28 * (long)psStack_258,(long)psVar42 * uVar21);
    psVar29 = SUB168(SEXT816((long)psStack_268) * SEXT816((long)uVar21),8);
    psVar32 = (secp256k1_fe *)((long)psVar27 * (long)psStack_258 + (long)psStack_268 * uVar21);
    lVar22 = (long)psVar29->n +
             (ulong)CARRY8((long)psVar27 * (long)psStack_258,(long)psStack_268 * uVar21) +
             SUB168(SEXT816((long)psVar27) * SEXT816((long)psStack_258),8);
    if ((uVar17 & 0x3ffffffffffffffe) != 0) goto LAB_00118425;
    uVar23 = uVar21;
    if (((ulong)psVar32 & 0x3fffffffffffffff) != 0) goto LAB_0011842a;
    lStack_210 = (long)uVar28 >> 0x3f;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar28;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = uStack_240;
    uVar21 = SUB168(auVar1 * auVar8,0);
    lStack_208 = (long)psVar27 >> 0x3f;
    uVar23 = uVar17 >> 0x3e | lVar34 * 4;
    uVar16 = (ulong)psVar32 >> 0x3e | lVar22 * 4;
    uVar17 = (long)psVar42 * uStack_260 + uVar21;
    uVar37 = uVar17 + uVar23;
    lVar34 = SUB168(SEXT816((long)psVar42) * SEXT816((long)uStack_260),8) +
             lStack_210 * uStack_240 + SUB168(auVar1 * auVar8,8) +
             (ulong)CARRY8((long)psVar42 * uStack_260,uVar21) + (lVar34 >> 0x3e) +
             (ulong)CARRY8(uVar17,uVar23);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = psVar27;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uStack_240;
    uVar21 = SUB168(auVar2 * auVar9,0);
    uVar23 = (long)psStack_268 * uStack_260 + uVar21;
    uStack_218 = uVar23 + uVar16;
    lVar22 = SUB168(SEXT816((long)psStack_268) * SEXT816((long)uStack_260),8) +
             uStack_240 * lStack_208 + SUB168(auVar2 * auVar9,8) +
             (ulong)CARRY8((long)psStack_268 * uStack_260,uVar21) + (lVar22 >> 0x3e) +
             (ulong)CARRY8(uVar23,uVar16);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar28;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = uStack_220;
    uVar21 = SUB168(auVar3 * auVar10,0);
    uVar17 = lVar34 * 4 | uVar37 >> 0x3e;
    psStack_258 = (secp256k1_fe *)(uVar37 & 0x3fffffffffffffff);
    uVar23 = lVar22 * 4 | uStack_218 >> 0x3e;
    uStack_218 = uStack_218 & 0x3fffffffffffffff;
    uVar16 = (long)psVar42 * uStack_250 + uVar21;
    uStack_240 = uVar16 + uVar17;
    lVar34 = SUB168(SEXT816((long)psVar42) * SEXT816((long)uStack_250),8) +
             lStack_210 * uStack_220 + SUB168(auVar3 * auVar10,8) +
             (ulong)CARRY8((long)psVar42 * uStack_250,uVar21) + (lVar34 >> 0x3e) +
             (ulong)CARRY8(uVar16,uVar17);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = psVar27;
    auVar11._8_8_ = 0;
    auVar11._0_8_ = uStack_220;
    uVar21 = SUB168(auVar4 * auVar11,0);
    uVar16 = (long)psStack_268 * uStack_250 + uVar21;
    uStack_260 = uVar16 + uVar23;
    lVar22 = SUB168(SEXT816((long)psStack_268) * SEXT816((long)uStack_250),8) +
             uStack_220 * lStack_208 + SUB168(auVar4 * auVar11,8) +
             (ulong)CARRY8((long)psStack_268 * uStack_250,uVar21) + (lVar22 >> 0x3e) +
             (ulong)CARRY8(uVar16,uVar23);
    uVar23 = lVar34 * 4 | uStack_240 >> 0x3e;
    uStack_240 = uStack_240 & 0x3fffffffffffffff;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar28;
    auVar12._8_8_ = 0;
    auVar12._0_8_ = uStack_230;
    uVar21 = SUB168(auVar5 * auVar12,0);
    uVar16 = lVar22 * 4 | uStack_260 >> 0x3e;
    uStack_260 = uStack_260 & 0x3fffffffffffffff;
    uVar17 = (long)psVar42 * uStack_228 + uVar21;
    uStack_220 = uVar17 + uVar23;
    lVar34 = SUB168(SEXT816((long)psVar42) * SEXT816((long)uStack_228),8) +
             lStack_210 * uStack_230 + SUB168(auVar5 * auVar12,8) +
             (ulong)CARRY8((long)psVar42 * uStack_228,uVar21) + (lVar34 >> 0x3e) +
             (ulong)CARRY8(uVar17,uVar23);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = psVar27;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = uStack_230;
    uVar21 = SUB168(auVar6 * auVar13,0);
    uVar23 = lStack_208 * uStack_230 + SUB168(auVar6 * auVar13,8);
    uVar17 = (long)psStack_268 * uStack_228 + uVar21;
    psVar32 = (secp256k1_fe *)(uVar17 + uVar16);
    psVar29 = (secp256k1_fe *)
              (SUB168(SEXT816((long)psStack_268) * SEXT816((long)uStack_228),8) + uVar23 +
               (ulong)CARRY8((long)psStack_268 * uStack_228,uVar21) + (lVar22 >> 0x3e) +
              (ulong)CARRY8(uVar17,uVar16));
    uVar16 = lVar34 * 4 | uStack_220 >> 0x3e;
    uStack_220 = uStack_220 & 0x3fffffffffffffff;
    uStack_250 = (ulong)psVar32 & 0x3fffffffffffffff;
    auVar1 = SEXT816((long)uVar28);
    uVar21 = uVar28 * uStack_1a8;
    uVar28 = uVar21 + uVar16;
    lVar22 = SUB168(auVar1 * SEXT816((long)uStack_1a8),8) + (lVar34 >> 0x3e) +
             (ulong)CARRY8(uVar21,uVar16);
    uVar21 = (long)psVar42 * (long)psStack_248;
    lVar34 = SUB168(SEXT816((long)psVar42) * SEXT816((long)psStack_248),8);
    if (lVar34 < 0) {
      lVar40 = (-0x8000000000000000 - lVar34) - (ulong)(uVar21 != 0);
      lVar38 = lVar22 - lVar40;
      bVar46 = SBORROW8(lVar22,lVar40) != SBORROW8(lVar38,(ulong)(uVar28 < -uVar21));
      lVar38 = lVar38 - (ulong)(uVar28 < -uVar21);
    }
    else {
      uVar16 = (ulong)(-uVar21 - 1 < uVar28);
      lVar38 = (0x7fffffffffffffff - lVar34) - lVar22;
      bVar46 = SBORROW8(0x7fffffffffffffff - lVar34,lVar22) != SBORROW8(lVar38,uVar16);
      lVar38 = lVar38 - uVar16;
    }
    psVar44 = &sStack_200;
    psVar42 = &secp256k1_const_modinfo_fe;
    sStack_200.n[0] = (uint64_t)psStack_258;
    sStack_200.n[1] = uStack_240;
    sStack_200.n[2] = uStack_220;
    sStack_160.n[0] = uStack_218;
    sStack_160.n[1] = uStack_260;
    sStack_160.n[2] = uStack_250;
    if (bVar46 != lVar38 < 0) goto LAB_0011842f;
    uVar16 = (ulong)psVar32 >> 0x3e | (long)psVar29 * 4;
    bVar46 = CARRY8(uVar28,uVar21);
    uVar28 = uVar28 + uVar21;
    lVar22 = lVar22 + lVar34 + (ulong)bVar46;
    auVar1 = SEXT816((long)psVar27);
    uVar21 = (long)psVar27 * uStack_1a8;
    psVar27 = (secp256k1_fe *)(uVar21 + uVar16);
    lVar38 = SUB168(auVar1 * SEXT816((long)uStack_1a8),8) + ((long)psVar29 >> 0x3e) +
             (ulong)CARRY8(uVar21,uVar16);
    uVar21 = (long)psStack_268 * (long)psStack_248;
    lVar34 = SUB168(SEXT816((long)psStack_268) * SEXT816((long)psStack_248),8);
    if (lVar34 < 0) {
      psVar32 = (secp256k1_fe *)((-0x8000000000000000 - lVar34) - (ulong)(uVar21 != 0));
      psVar29 = (secp256k1_fe *)
                ((lVar38 - (long)psVar32) - (ulong)(psVar27 < (secp256k1_fe *)-uVar21));
      if ((SBORROW8(lVar38,(long)psVar32) !=
          SBORROW8(lVar38 - (long)psVar32,(ulong)(psVar27 < (secp256k1_fe *)-uVar21))) ==
          (long)psVar29 < 0) goto LAB_001180de;
      goto LAB_00118434;
    }
    psVar29 = (secp256k1_fe *)(-1 - uVar21);
    lVar40 = (0x7fffffffffffffff - lVar34) - lVar38;
    psVar32 = (secp256k1_fe *)(lVar40 - (ulong)(psVar29 < psVar27));
    if ((SBORROW8(0x7fffffffffffffff - lVar34,lVar38) != SBORROW8(lVar40,(ulong)(psVar29 < psVar27))
        ) != (long)psVar32 < 0) goto LAB_00118434;
LAB_001180de:
    bVar46 = CARRY8((ulong)psVar27,uVar21);
    psVar27 = (secp256k1_fe *)((long)psVar27->n + uVar21);
    lVar34 = lVar38 + lVar34 + (ulong)bVar46;
    uVar23 = lVar22 * 4 | uVar28 >> 0x3e;
    uVar28 = uVar28 & 0x3fffffffffffffff;
    sStack_160.n[3] = (ulong)psVar27 & 0x3fffffffffffffff;
    sStack_200.n[3] = uVar28;
    if ((lVar22 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar23) != -1) goto LAB_00118439;
    psVar27 = (secp256k1_fe *)((ulong)psVar27 >> 0x3e | lVar34 * 4);
    sStack_200.n[4] = uVar23;
    if ((lVar34 >> 0x3e) + -1 + (ulong)((secp256k1_fe *)0x7fffffffffffffff < psVar27) != -1)
    goto LAB_0011843e;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x11816e;
    psVar32 = psVar44;
    uStack_228 = sStack_160.n[3];
    sStack_160.n[4] = (uint64_t)psVar27;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,-1);
    if (iVar14 < 1) goto LAB_00118443;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x11818b;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (0 < iVar14) goto LAB_00118448;
    psVar44 = &sStack_160;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x1181b2;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,-1);
    if (iVar14 < 1) goto LAB_0011844d;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x1181cf;
    psVar32 = psVar44;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar44,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    psVar18 = psStack_258;
    if (-1 < iVar14) goto LAB_00118452;
    iVar14 = iStack_234 + 1;
    uVar21 = uStack_218;
    uVar16 = uVar23;
    psVar44 = psStack_258;
    psStack_248 = psVar27;
    uStack_230 = uVar28;
  } while (iVar14 != 10);
  psVar32 = &sStack_160;
  psVar29 = (secp256k1_fe *)0x5;
  pcStack_278 = (code *)0x11821b;
  iVar14 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)psVar32,5,&SECP256K1_SIGNED62_ONE,0);
  if (iVar14 == 0) {
    pcStack_278 = (code *)0x118240;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)&sStack_200,5,&SECP256K1_SIGNED62_ONE,-1);
    psVar25 = extraout_RDX;
    if (iVar14 == 0) {
LAB_001182d0:
      pcStack_278 = (code *)0x1182e3;
      secp256k1_modinv64_normalize_62((secp256k1_modinv64_signed62 *)auStack_110,uVar23,psVar25);
      psVar27 = psStack_1b0;
      sStack_190.n[4] = auStack_110._32_8_;
      sStack_190.n[2] = auStack_110._16_8_;
      sStack_190.n[3] = auStack_110._24_8_;
      sStack_190.n[0] = auStack_110._0_8_;
      sStack_190.n[1] = auStack_110._8_8_;
      pcStack_278 = (code *)0x118311;
      secp256k1_fe_from_signed62(psStack_1b0,(secp256k1_modinv64_signed62 *)&sStack_190);
      psVar27->magnitude = (uint)(0 < psStack_1c8->magnitude);
      psVar27->normalized = 1;
      pcStack_278 = (code *)0x118334;
      secp256k1_fe_verify(psVar27);
      uVar16 = (psVar27->n[4] >> 0x30) * lStack_1d0 + psVar27->n[0];
      uVar21 = (uVar16 >> 0x34) + psVar27->n[1];
      uVar17 = (uVar21 >> 0x34) + psVar27->n[2];
      uVar37 = (uVar17 >> 0x34) + psVar27->n[3];
      psVar29 = (secp256k1_fe *)((uVar37 >> 0x34) + (psVar27->n[4] & 0xffffffffffff));
      psVar32 = (secp256k1_fe *)
                ((uVar16 ^ 0x1000003d0) & uVar21 & uVar17 & uVar37 &
                ((ulong)psVar29 ^ 0xf000000000000));
      if ((uStack_1c0 != 0xfffffffffffff && uStack_1b8 != 0) !=
          (psVar32 == (secp256k1_fe *)0xfffffffffffff ||
          ((uVar21 | uVar16 | uVar17 | uVar37) & 0xfffffffffffff) == 0 &&
          psVar29 == (secp256k1_fe *)0x0)) {
        secp256k1_fe_verify(psVar27);
        return;
      }
      goto LAB_0011845c;
    }
    pcStack_278 = (code *)0x118263;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)&sStack_200,5,&SECP256K1_SIGNED62_ONE,1);
    psVar25 = extraout_RDX_00;
    if (iVar14 == 0) goto LAB_001182d0;
    psVar32 = &sStack_190;
    psVar29 = (secp256k1_fe *)0x5;
    pcStack_278 = (code *)0x118282;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar32,5,&SECP256K1_SIGNED62_ONE,0);
    if (iVar14 == 0) {
      psVar32 = (secp256k1_fe *)auStack_110;
      psVar29 = (secp256k1_fe *)0x5;
      pcStack_278 = (code *)0x1182a5;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar32,5,&SECP256K1_SIGNED62_ONE,0);
      if (iVar14 == 0) {
        psVar32 = &sStack_200;
        psVar29 = (secp256k1_fe *)0x5;
        pcStack_278 = (code *)0x1182c8;
        iVar14 = secp256k1_modinv64_mul_cmp_62
                           ((secp256k1_modinv64_signed62 *)psVar32,5,
                            &secp256k1_const_modinfo_fe.modulus,1);
        psVar25 = extraout_RDX_01;
        if (iVar14 == 0) goto LAB_001182d0;
      }
    }
  }
  else {
LAB_00118457:
    pcStack_278 = (code *)0x11845c;
    secp256k1_fe_inv_cold_6();
LAB_0011845c:
    pcStack_278 = (code *)0x118461;
    secp256k1_fe_inv_cold_8();
  }
  pcStack_278 = (code *)0x118466;
  secp256k1_fe_inv_cold_7();
  uVar21 = uVar23;
LAB_00118466:
  pcStack_278 = secp256k1_fe_from_signed62;
  secp256k1_fe_inv_cold_3();
  uVar16 = psVar29->n[0];
  if (uVar16 >> 0x3e == 0) {
    uVar23 = psVar29->n[1];
    if (0x3fffffffffffffff < uVar23) goto LAB_0011853a;
    uVar17 = psVar29->n[2];
    if (0x3fffffffffffffff < uVar17) goto LAB_0011853f;
    uVar37 = psVar29->n[3];
    if (0x3fffffffffffffff < uVar37) goto LAB_00118544;
    uVar39 = psVar29->n[4];
    if (uVar39 < 0x100) {
      psVar32->n[0] = uVar16 & 0xfffffffffffff;
      psVar32->n[1] = (uVar23 & 0x3ffffffffff) << 10 | uVar16 >> 0x34;
      psVar32->n[2] = (uVar17 & 0xffffffff) << 0x14 | uVar23 >> 0x2a;
      psVar32->n[3] = (ulong)((uint)uVar37 & 0x3fffff) << 0x1e | uVar17 >> 0x20;
      psVar32->n[4] = uVar39 << 0x28 | uVar37 >> 0x16;
      return;
    }
  }
  else {
    pcStack_280 = (code *)0x11853a;
    secp256k1_fe_from_signed62_cold_5();
LAB_0011853a:
    pcStack_280 = (code *)0x11853f;
    secp256k1_fe_from_signed62_cold_4();
LAB_0011853f:
    pcStack_280 = (code *)0x118544;
    secp256k1_fe_from_signed62_cold_3();
LAB_00118544:
    pcStack_280 = (code *)0x118549;
    secp256k1_fe_from_signed62_cold_2();
  }
  pcStack_280 = secp256k1_modinv64_update_de_62;
  secp256k1_fe_from_signed62_cold_1();
  pcStack_280 = (code *)uVar28;
  psStack_288 = psVar18;
  uStack_290 = uVar21;
  psStack_298 = psVar42;
  uStack_2a0 = uVar24;
  psStack_2a8 = psVar27;
  uVar26 = psVar32->n[0];
  psStack_2b8 = (secp256k1_fe *)psVar32->n[1];
  uStack_2c8 = psVar32->n[2];
  uStack_2d0 = psVar32->n[3];
  uStack_2f0 = psVar32->n[4];
  psVar44 = (secp256k1_fe *)psVar29->n[0];
  uStack_2b0 = psVar29->n[1];
  psStack_2d8 = (secp256k1_fe *)psVar29->n[2];
  psStack_2c0 = (secp256k1_fe *)psVar29->n[3];
  uStack_310 = *extraout_RDX_02;
  psStack_308 = (secp256k1_fe *)extraout_RDX_02[1];
  uStack_320 = extraout_RDX_02[2];
  psStack_318 = (secp256k1_fe *)extraout_RDX_02[3];
  uStack_2e8 = psVar29->n[4];
  psVar30 = (secp256k1_fe *)0x5;
  uVar21 = 0xfffffffffffffffe;
  psStack_328 = (secp256k1_fe *)0x1185ea;
  psVar33 = psVar32;
  iVar14 = secp256k1_modinv64_mul_cmp_62
                     ((secp256k1_modinv64_signed62 *)psVar32,5,&secp256k1_const_modinfo_fe.modulus,
                      -2);
  psVar27 = psVar32;
  if (iVar14 < 1) {
LAB_00118e84:
    psStack_328 = (secp256k1_fe *)0x118e89;
    secp256k1_modinv64_update_de_62_cold_28();
LAB_00118e89:
    psStack_328 = (secp256k1_fe *)0x118e8e;
    secp256k1_modinv64_update_de_62_cold_27();
LAB_00118e8e:
    psStack_328 = (secp256k1_fe *)0x118e93;
    secp256k1_modinv64_update_de_62_cold_26();
LAB_00118e93:
    psStack_328 = (secp256k1_fe *)0x118e98;
    secp256k1_modinv64_update_de_62_cold_25();
LAB_00118e98:
    psStack_328 = (secp256k1_fe *)0x118e9d;
    secp256k1_modinv64_update_de_62_cold_24();
LAB_00118e9d:
    psStack_328 = (secp256k1_fe *)0x118ea2;
    secp256k1_modinv64_update_de_62_cold_23();
LAB_00118ea2:
    psStack_328 = (secp256k1_fe *)0x118ea7;
    secp256k1_modinv64_update_de_62_cold_1();
LAB_00118ea7:
    psStack_328 = (secp256k1_fe *)0x118eac;
    secp256k1_modinv64_update_de_62_cold_2();
LAB_00118eac:
    psStack_328 = (secp256k1_fe *)0x118eb1;
    secp256k1_modinv64_update_de_62_cold_17();
LAB_00118eb1:
    psStack_328 = (secp256k1_fe *)0x118eb6;
    secp256k1_modinv64_update_de_62_cold_11();
LAB_00118eb6:
    psStack_328 = (secp256k1_fe *)0x118ebb;
    secp256k1_modinv64_update_de_62_cold_8();
LAB_00118ebb:
    psStack_328 = (secp256k1_fe *)0x118ec0;
    secp256k1_modinv64_update_de_62_cold_7();
LAB_00118ec0:
    psStack_328 = (secp256k1_fe *)0x118ec5;
    secp256k1_modinv64_update_de_62_cold_6();
LAB_00118ec5:
    psStack_328 = (secp256k1_fe *)0x118eca;
    secp256k1_modinv64_update_de_62_cold_5();
LAB_00118eca:
    psStack_328 = (secp256k1_fe *)0x118ecf;
    secp256k1_modinv64_update_de_62_cold_4();
LAB_00118ecf:
    psStack_328 = (secp256k1_fe *)0x118ed4;
    secp256k1_modinv64_update_de_62_cold_3();
LAB_00118ed4:
    psStack_328 = (secp256k1_fe *)0x118ed9;
    secp256k1_modinv64_update_de_62_cold_22();
  }
  else {
    uVar21 = 1;
    psVar30 = (secp256k1_fe *)0x5;
    psStack_328 = (secp256k1_fe *)0x11860b;
    psVar33 = psVar32;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar32,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (-1 < iVar14) goto LAB_00118e89;
    psVar30 = (secp256k1_fe *)0x5;
    uVar21 = 0xfffffffffffffffe;
    psStack_328 = (secp256k1_fe *)0x11862e;
    psVar33 = psVar29;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar29,5,&secp256k1_const_modinfo_fe.modulus
                        ,-2);
    if (iVar14 < 1) goto LAB_00118e8e;
    uVar21 = 1;
    psVar30 = (secp256k1_fe *)0x5;
    psStack_328 = (secp256k1_fe *)0x11864f;
    psVar33 = psVar29;
    iVar14 = secp256k1_modinv64_mul_cmp_62
                       ((secp256k1_modinv64_signed62 *)psVar29,5,&secp256k1_const_modinfo_fe.modulus
                        ,1);
    if (-1 < iVar14) goto LAB_00118e93;
    psStack_328 = (secp256k1_fe *)0x11866b;
    psVar18 = (secp256k1_fe *)secp256k1_modinv64_abs(uStack_310);
    psStack_328 = (secp256k1_fe *)0x118678;
    psVar33 = psStack_308;
    iVar19 = secp256k1_modinv64_abs((int64_t)psStack_308);
    uVar21 = 0x4000000000000000 - iVar19;
    if ((long)uVar21 < (long)psVar18) goto LAB_00118e98;
    psStack_328 = (secp256k1_fe *)0x118693;
    psVar18 = (secp256k1_fe *)secp256k1_modinv64_abs(uStack_320);
    psStack_328 = (secp256k1_fe *)0x1186a0;
    psVar33 = psStack_318;
    iVar19 = secp256k1_modinv64_abs((int64_t)psStack_318);
    uVar21 = 0x4000000000000000 - iVar19;
    if ((long)uVar21 < (long)psVar18) goto LAB_00118e9d;
    psVar30 = (secp256k1_fe *)(uStack_310 * uVar26);
    uVar21 = SUB168(SEXT816((long)uStack_310) * SEXT816((long)uVar26),8);
    uVar16 = (long)psStack_308 * (long)psVar44;
    lVar34 = SUB168(SEXT816((long)psStack_308) * SEXT816((long)psVar44),8);
    psVar27 = (secp256k1_fe *)0x7fffffffffffffff;
    psVar33 = (secp256k1_fe *)~uVar16;
    lVar22 = (0x7fffffffffffffff - lVar34) - uVar21;
    psStack_2f8 = psVar32;
    if ((SBORROW8(0x7fffffffffffffff - lVar34,uVar21) != SBORROW8(lVar22,(ulong)(psVar33 < psVar30))
        ) != (long)(lVar22 - (ulong)(psVar33 < psVar30)) < 0 && -1 < lVar34) goto LAB_00118ed4;
    puVar20 = (uint64_t *)((long)psVar30->n + uVar16);
    psVar32 = (secp256k1_fe *)(lVar34 + uVar21 + (ulong)CARRY8(uVar16,(ulong)psVar30));
    psVar18 = (secp256k1_fe *)(uStack_320 * uVar26);
    lVar34 = SUB168(SEXT816((long)uStack_320) * SEXT816((long)uVar26),8);
    uVar16 = (long)psStack_318 * (long)psVar44;
    psVar33 = SUB168(SEXT816((long)psStack_318) * SEXT816((long)psVar44),8);
    uVar21 = (ulong)((secp256k1_fe *)(-1 - uVar16) < psVar18);
    lVar22 = (0x7fffffffffffffff - (long)psVar33) - lVar34;
    bVar46 = (SBORROW8(0x7fffffffffffffff - (long)psVar33,lVar34) != SBORROW8(lVar22,uVar21)) !=
             (long)(lVar22 - uVar21) < 0;
    uVar21 = CONCAT71((int7)(-1 - uVar16 >> 8),bVar46 && -1 < (long)psVar33);
    if (!bVar46 || -1 >= (long)psVar33) {
      puVar41 = (uint64_t *)((long)uStack_2f0 >> 0x3f);
      uVar21 = (long)uStack_2e8 >> 0x3f;
      lVar22 = ((ulong)psStack_308 & uVar21) + (uStack_310 & (ulong)puVar41);
      psVar44 = (secp256k1_fe *)0xfffffffefffffc2f;
      puVar35 = (uint64_t *)((long)psVar18->n + uVar16);
      psVar33 = (secp256k1_fe *)((long)psVar33->n + (ulong)CARRY8(uVar16,(ulong)psVar18) + lVar34);
      uVar16 = 0x27c7f6e22ddacacf;
      psVar30 = (secp256k1_fe *)
                (lVar22 - ((long)puVar20 * 0x27c7f6e22ddacacf + lVar22 & 0x3fffffffffffffffU));
      psVar18 = (secp256k1_fe *)((long)psVar30 * -0x1000003d1);
      uVar26 = SUB168(SEXT816((long)psVar30) * SEXT816(-0x1000003d1),8);
      psStack_300 = psVar29;
      if (0 < (long)psVar30) {
        lVar34 = (-0x8000000000000000 - uVar26) - (ulong)(psVar18 != (secp256k1_fe *)0x0);
        uVar23 = (ulong)(puVar20 < (undefined1 *)((long)psVar30 * 0x1000003d1));
        lVar22 = (long)psVar32 - lVar34;
        if ((SBORROW8((long)psVar32,lVar34) != SBORROW8(lVar22,uVar23)) ==
            (long)(lVar22 - uVar23) < 0) goto LAB_001187d9;
LAB_00118933:
        psStack_328 = (secp256k1_fe *)0x118938;
        secp256k1_modinv64_update_de_62_cold_20();
LAB_00118938:
        uVar23 = (ulong)((undefined1 *)(-1 - (long)puVar20) < puVar35);
        lVar22 = (0x7fffffffffffffff - (long)psVar44) - (long)psVar33;
        psVar29 = psVar32;
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar44,(long)psVar33) != SBORROW8(lVar22,uVar23))
            != (long)(lVar22 - uVar23) < 0) goto LAB_00118954;
LAB_00118848:
        bVar46 = CARRY8((ulong)puVar20,(ulong)puVar35);
        puVar20 = (uint64_t *)((long)puVar35 + (long)puVar20);
        psVar44 = (secp256k1_fe *)((long)psVar33->n + (ulong)bVar46 + (long)psVar44->n);
        if (((ulong)psVar18 & 0x3fffffffffffffff) != 0) goto LAB_00118ea2;
        if (((ulong)puVar20 & 0x3fffffffffffffff) == 0) {
          psVar18 = (secp256k1_fe *)((ulong)psVar18 >> 0x3e | uVar26 << 2);
          puVar41 = (uint64_t *)((long)psVar18->n + uStack_310 * (long)psStack_2b8);
          uVar16 = SUB168(SEXT816((long)uStack_310) * SEXT816((long)psStack_2b8),8) +
                   ((long)uVar26 >> 0x3e) +
                   (ulong)CARRY8(uStack_310 * (long)psStack_2b8,(ulong)psVar18);
          uVar23 = (long)psStack_308 * uStack_2b0;
          lVar22 = SUB168(SEXT816((long)psStack_308) * SEXT816((long)uStack_2b0),8);
          psVar32 = psStack_2b8;
          uVar26 = uStack_2b0;
          psStack_2e0 = psVar29;
          if (lVar22 < 0) goto LAB_00118959;
          uVar24 = (ulong)((undefined1 *)(-1 - uVar23) < puVar41);
          lVar34 = (0x7fffffffffffffff - lVar22) - uVar16;
          if ((SBORROW8(0x7fffffffffffffff - lVar22,uVar16) != SBORROW8(lVar34,uVar24)) ==
              (long)(lVar34 - uVar24) < 0) goto LAB_001188c9;
          goto LAB_0011897b;
        }
        goto LAB_00118ea7;
      }
      uVar23 = (ulong)((undefined1 *)((long)psVar30 * 0x1000003d1 + -1) < puVar20);
      lVar22 = (0x7fffffffffffffff - uVar26) - (long)psVar32;
      if ((SBORROW8(0x7fffffffffffffff - uVar26,(long)psVar32) != SBORROW8(lVar22,uVar23)) !=
          (long)(lVar22 - uVar23) < 0) goto LAB_00118933;
LAB_001187d9:
      lVar22 = (uVar21 & (ulong)psStack_318) + ((ulong)puVar41 & uStack_320);
      uVar16 = (long)puVar35 * 0x27c7f6e22ddacacf + lVar22 & 0x3fffffffffffffff;
      uVar21 = lVar22 - uVar16;
      bVar46 = CARRY8((ulong)psVar18,(ulong)puVar20);
      psVar18 = (secp256k1_fe *)((long)puVar20 + (long)psVar18->n);
      uVar26 = (long)psVar32->n + bVar46 + uVar26;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar21;
      puVar20 = SUB168(auVar7 * ZEXT816(0xfffffffefffffc2f),0);
      psVar32 = (secp256k1_fe *)((long)uVar21 >> 0x3f);
      puVar41 = (uint64_t *)(SUB168(auVar7 * ZEXT816(0xfffffffefffffc2f),8) - uVar21);
      psVar44 = (secp256k1_fe *)((long)psVar32 * -0x1000003d1 + (long)puVar41);
      if ((long)uVar21 < 1) goto LAB_00118938;
      lVar34 = (-0x8000000000000000 - (long)psVar44) - (ulong)(puVar20 != (uint64_t *)0x0);
      lVar22 = (long)psVar33 - lVar34;
      psVar29 = psVar32;
      if ((SBORROW8((long)psVar33,lVar34) !=
          SBORROW8(lVar22,(ulong)(puVar35 < (undefined1 *)-(long)puVar20))) ==
          (long)(lVar22 - (ulong)(puVar35 < (undefined1 *)-(long)puVar20)) < 0) goto LAB_00118848;
LAB_00118954:
      psStack_328 = (secp256k1_fe *)0x118959;
      secp256k1_modinv64_update_de_62_cold_19();
      uVar23 = extraout_RAX;
      lVar22 = extraout_RDX_03;
LAB_00118959:
      lVar38 = (-0x8000000000000000 - lVar22) - (ulong)(uVar23 != 0);
      lVar34 = uVar16 - lVar38;
      if ((SBORROW8(uVar16,lVar38) != SBORROW8(lVar34,(ulong)(puVar41 < (undefined1 *)-uVar23))) ==
          (long)(lVar34 - (ulong)(puVar41 < (undefined1 *)-uVar23)) < 0) {
LAB_001188c9:
        uVar24 = (ulong)puVar20 >> 0x3e | (long)psVar44 << 2;
        bVar46 = CARRY8((ulong)puVar41,uVar23);
        puVar41 = (uint64_t *)((long)puVar41 + uVar23);
        uVar16 = uVar16 + lVar22 + (ulong)bVar46;
        psVar18 = (secp256k1_fe *)(uStack_320 * (long)psVar32 + uVar24);
        psVar32 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_320) * SEXT816((long)psVar32),8) +
                   ((long)psVar44 >> 0x3e) + (ulong)CARRY8(uStack_320 * (long)psVar32,uVar24));
        uVar23 = (long)psStack_318 * uVar26;
        lVar22 = SUB168(SEXT816((long)psStack_318) * SEXT816((long)uVar26),8);
        if (lVar22 < 0) goto LAB_00118980;
        psVar33 = (secp256k1_fe *)(-1 - uVar23);
        lVar34 = (0x7fffffffffffffff - lVar22) - (long)psVar32;
        bVar46 = SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar32) !=
                 SBORROW8(lVar34,(ulong)(psVar33 < psVar18));
        psVar29 = (secp256k1_fe *)(lVar34 - (ulong)(psVar33 < psVar18));
      }
      else {
LAB_0011897b:
        psStack_328 = (secp256k1_fe *)0x118980;
        secp256k1_modinv64_update_de_62_cold_18();
        uVar23 = extraout_RAX_00;
        lVar22 = extraout_RDX_04;
LAB_00118980:
        lVar38 = (-0x8000000000000000 - lVar22) - (ulong)(uVar23 != 0);
        lVar34 = (long)psVar32 - lVar38;
        bVar46 = SBORROW8((long)psVar32,lVar38) !=
                 SBORROW8(lVar34,(ulong)(psVar18 < (secp256k1_fe *)-uVar23));
        psVar33 = (secp256k1_fe *)(lVar34 - (ulong)(psVar18 < (secp256k1_fe *)-uVar23));
        psVar29 = psVar33;
      }
      psVar44 = psStack_2d8;
      psVar43 = psStack_300;
      if (bVar46 != (long)psVar29 < 0) goto LAB_00118eac;
      uVar17 = (long)psVar18->n + uVar23;
      lVar38 = (long)psVar32->n + (ulong)CARRY8((ulong)psVar18,uVar23) + lVar22;
      uVar24 = uVar16 << 2 | (ulong)puVar41 >> 0x3e;
      uVar28 = (ulong)puVar41 & 0x3fffffffffffffff;
      uVar23 = uStack_310 * uStack_2c8 + uVar24;
      lVar34 = SUB168(SEXT816((long)uStack_310) * SEXT816((long)uStack_2c8),8) +
               ((long)uVar16 >> 0x3e) + (ulong)CARRY8(uStack_310 * uStack_2c8,uVar24);
      psStack_2f8->n[0] = uVar28;
      uVar16 = (long)psStack_308 * (long)psStack_2d8;
      lVar22 = SUB168(SEXT816((long)psStack_308) * SEXT816((long)psStack_2d8),8);
      psStack_300->n[0] = uVar17 & 0x3fffffffffffffff;
      if (lVar22 < 0) {
        lVar40 = (-0x8000000000000000 - lVar22) - (ulong)(uVar16 != 0);
        if ((SBORROW8(lVar34,lVar40) != SBORROW8(lVar34 - lVar40,(ulong)(uVar23 < -uVar16))) !=
            (long)((lVar34 - lVar40) - (ulong)(uVar23 < -uVar16)) < 0) goto LAB_00118c18;
LAB_00118a16:
        uVar17 = uVar17 >> 0x3e | lVar38 * 4;
        bVar46 = CARRY8(uVar23,uVar16);
        uVar23 = uVar23 + uVar16;
        lVar34 = lVar34 + lVar22 + (ulong)bVar46;
        uVar28 = uStack_320 * uStack_2c8 + uVar17;
        lVar40 = SUB168(SEXT816((long)uStack_320) * SEXT816((long)uStack_2c8),8) + (lVar38 >> 0x3e)
                 + (ulong)CARRY8(uStack_320 * uStack_2c8,uVar17);
        uVar16 = (long)psStack_318 * (long)psStack_2d8;
        lVar22 = SUB168(SEXT816((long)psStack_318) * SEXT816((long)psStack_2d8),8);
        if (lVar22 < 0) goto LAB_00118c1d;
        uVar24 = -uVar16 - 1;
        lVar36 = (0x7fffffffffffffff - lVar22) - lVar40;
        lVar38 = lVar36 - (ulong)(uVar24 < uVar28);
        if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar40) !=
            SBORROW8(lVar36,(ulong)(uVar24 < uVar28))) != lVar38 < 0) goto LAB_00118c3f;
LAB_00118a67:
        bVar46 = CARRY8(uVar28,uVar16);
        uVar28 = uVar28 + uVar16;
        lVar40 = lVar40 + lVar22 + (ulong)bVar46;
        uVar16 = lVar34 << 2 | uVar23 >> 0x3e;
        uVar17 = uVar28 & 0x3fffffffffffffff;
        uVar24 = uStack_310 * uStack_2d0 + uVar16;
        lVar38 = SUB168(SEXT816((long)uStack_310) * SEXT816((long)uStack_2d0),8) + (lVar34 >> 0x3e)
                 + (ulong)CARRY8(uStack_310 * uStack_2d0,uVar16);
        psStack_2f8->n[1] = uVar23 & 0x3fffffffffffffff;
        uVar16 = (long)psStack_308 * (long)psStack_2c0;
        lVar22 = SUB168(SEXT816((long)psStack_308) * SEXT816((long)psStack_2c0),8);
        psVar43->n[1] = uVar17;
        psVar44 = psStack_2c0;
        if (lVar22 < 0) goto LAB_00118c44;
        uVar23 = (ulong)(-uVar16 - 1 < uVar24);
        lVar34 = (0x7fffffffffffffff - lVar22) - lVar38;
        if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar38) != SBORROW8(lVar34,uVar23)) !=
            (long)(lVar34 - uVar23) < 0) goto LAB_00118c66;
LAB_00118ad7:
        uVar23 = uVar28 >> 0x3e | lVar40 << 2;
        bVar46 = CARRY8(uVar24,uVar16);
        uVar24 = uVar24 + uVar16;
        lVar38 = lVar38 + lVar22 + (ulong)bVar46;
        psVar43 = (secp256k1_fe *)(uStack_320 * uStack_2d0 + uVar23);
        uVar17 = SUB168(SEXT816((long)uStack_320) * SEXT816((long)uStack_2d0),8) + (lVar40 >> 0x3e)
                 + (ulong)CARRY8(uStack_320 * uStack_2d0,uVar23);
        uVar16 = (long)psStack_318 * (long)psVar44;
        lVar22 = SUB168(SEXT816((long)psStack_318) * SEXT816((long)psVar44),8);
        if (lVar22 < 0) goto LAB_00118c6b;
        psVar33 = (secp256k1_fe *)(-1 - uVar16);
        lVar34 = (0x7fffffffffffffff - lVar22) - uVar17;
        uVar23 = lVar34 - (ulong)(psVar33 < psVar43);
        if ((SBORROW8(0x7fffffffffffffff - lVar22,uVar17) !=
            SBORROW8(lVar34,(ulong)(psVar33 < psVar43))) == (long)uVar23 < 0) goto LAB_00118b32;
LAB_00118c90:
        psStack_328 = (secp256k1_fe *)0x118c95;
        secp256k1_modinv64_update_de_62_cold_13();
        uVar16 = extraout_RAX_04;
        lVar22 = extraout_RDX_08;
LAB_00118c95:
        lVar38 = (-0x8000000000000000 - lVar22) - (ulong)(uVar16 != 0);
        uVar24 = ((long)psVar33 - lVar38) - (ulong)(uVar23 < -uVar16);
        if ((SBORROW8((long)psVar33,lVar38) !=
            SBORROW8((long)psVar33 - lVar38,(ulong)(uVar23 < -uVar16))) == (long)uVar24 < 0)
        goto LAB_00118ba4;
LAB_00118cb0:
        psStack_328 = (secp256k1_fe *)0x118cb5;
        secp256k1_modinv64_update_de_62_cold_12();
        uVar16 = extraout_RAX_05;
        lVar22 = extraout_RDX_09;
LAB_00118cb5:
        lVar40 = (-0x8000000000000000 - lVar22) - (ulong)(uVar16 != 0);
        lVar34 = lVar38 - lVar40;
        bVar46 = SBORROW8(lVar38,lVar40) != SBORROW8(lVar34,(ulong)(uVar24 < -uVar16));
        lVar34 = lVar34 - (ulong)(uVar24 < -uVar16);
      }
      else {
        uVar24 = (ulong)(-uVar16 - 1 < uVar23);
        lVar36 = (0x7fffffffffffffff - lVar22) - lVar34;
        lVar40 = lVar36 - uVar24;
        if ((SBORROW8(0x7fffffffffffffff - lVar22,lVar34) != SBORROW8(lVar36,uVar24)) == lVar40 < 0)
        goto LAB_00118a16;
LAB_00118c18:
        psStack_328 = (secp256k1_fe *)0x118c1d;
        secp256k1_modinv64_update_de_62_cold_16();
        uVar16 = extraout_RAX_01;
        lVar22 = extraout_RDX_05;
LAB_00118c1d:
        lVar38 = (-0x8000000000000000 - lVar22) - (ulong)(uVar16 != 0);
        uVar24 = (lVar40 - lVar38) - (ulong)(uVar28 < -uVar16);
        if ((SBORROW8(lVar40,lVar38) != SBORROW8(lVar40 - lVar38,(ulong)(uVar28 < -uVar16))) ==
            (long)uVar24 < 0) goto LAB_00118a67;
LAB_00118c3f:
        psStack_328 = (secp256k1_fe *)0x118c44;
        secp256k1_modinv64_update_de_62_cold_15();
        uVar16 = extraout_RAX_02;
        lVar22 = extraout_RDX_06;
LAB_00118c44:
        lVar36 = (-0x8000000000000000 - lVar22) - (ulong)(uVar16 != 0);
        lVar34 = lVar38 - lVar36;
        if ((SBORROW8(lVar38,lVar36) != SBORROW8(lVar34,(ulong)(uVar24 < -uVar16))) ==
            (long)(lVar34 - (ulong)(uVar24 < -uVar16)) < 0) goto LAB_00118ad7;
LAB_00118c66:
        psStack_328 = (secp256k1_fe *)0x118c6b;
        secp256k1_modinv64_update_de_62_cold_14();
        uVar16 = extraout_RAX_03;
        lVar22 = extraout_RDX_07;
LAB_00118c6b:
        uVar23 = (-0x8000000000000000 - lVar22) - (ulong)(uVar16 != 0);
        psVar33 = (secp256k1_fe *)((uVar17 - uVar23) - (ulong)(psVar43 < (secp256k1_fe *)-uVar16));
        if ((SBORROW8(uVar17,uVar23) !=
            SBORROW8(uVar17 - uVar23,(ulong)(psVar43 < (secp256k1_fe *)-uVar16))) !=
            (long)psVar33 < 0) goto LAB_00118c90;
LAB_00118b32:
        bVar46 = CARRY8((ulong)psVar43,uVar16);
        psVar43 = (secp256k1_fe *)((long)psVar43->n + uVar16);
        uVar17 = uVar17 + lVar22 + (ulong)bVar46;
        uVar16 = lVar38 << 2 | uVar24 >> 0x3e;
        uVar23 = uStack_310 * uStack_2f0 + uVar16;
        psVar33 = (secp256k1_fe *)
                  (SUB168(SEXT816((long)uStack_310) * SEXT816((long)uStack_2f0),8) +
                   (lVar38 >> 0x3e) + (ulong)CARRY8(uStack_310 * uStack_2f0,uVar16));
        psStack_2f8->n[2] = uVar24 & 0x3fffffffffffffff;
        uVar16 = (long)psStack_308 * uStack_2e8;
        lVar22 = SUB168(SEXT816((long)psStack_308) * SEXT816((long)uStack_2e8),8);
        psStack_300->n[2] = (ulong)psVar43 & 0x3fffffffffffffff;
        if (lVar22 < 0) goto LAB_00118c95;
        uVar24 = -uVar16 - 1;
        lVar34 = (0x7fffffffffffffff - lVar22) - (long)psVar33;
        lVar38 = lVar34 - (ulong)(uVar24 < uVar23);
        if ((SBORROW8(0x7fffffffffffffff - lVar22,(long)psVar33) !=
            SBORROW8(lVar34,(ulong)(uVar24 < uVar23))) != lVar38 < 0) goto LAB_00118cb0;
LAB_00118ba4:
        uVar28 = (ulong)psVar43 >> 0x3e | uVar17 << 2;
        bVar46 = CARRY8(uVar23,uVar16);
        uVar23 = uVar23 + uVar16;
        psVar33 = (secp256k1_fe *)((long)psVar33->n + (ulong)bVar46 + lVar22);
        uVar24 = uStack_320 * uStack_2f0 + uVar28;
        lVar38 = SUB168(SEXT816((long)uStack_320) * SEXT816((long)uStack_2f0),8) +
                 ((long)uVar17 >> 0x3e) + (ulong)CARRY8(uStack_320 * uStack_2f0,uVar28);
        uVar16 = (long)psStack_318 * uStack_2e8;
        lVar22 = SUB168(SEXT816((long)psStack_318) * SEXT816((long)uStack_2e8),8);
        if (lVar22 < 0) goto LAB_00118cb5;
        uVar28 = (ulong)(-uVar16 - 1 < uVar24);
        lVar34 = (0x7fffffffffffffff - lVar22) - lVar38;
        bVar46 = SBORROW8(0x7fffffffffffffff - lVar22,lVar38) != SBORROW8(lVar34,uVar28);
        lVar34 = lVar34 - uVar28;
      }
      psVar18 = psStack_2e0;
      psVar44 = psStack_300;
      if (bVar46 != lVar34 < 0) goto LAB_00118eb1;
      uVar28 = uVar24 + uVar16;
      lVar22 = lVar38 + lVar22 + (ulong)CARRY8(uVar24,uVar16);
      uVar24 = ((long)psVar30 >> 0x3f) << 8 | (ulong)psVar30 >> 0x38;
      uVar16 = (long)psVar30 * 0x100;
      if ((long)psVar30 < 0) {
        uVar17 = (long)psVar30 * -0x100;
        psVar30 = (secp256k1_fe *)((-0x8000000000000000 - uVar24) - (ulong)(uVar16 != 0));
        uVar17 = (ulong)(uVar23 < uVar17);
        if ((SBORROW8((long)psVar33,(long)psVar30) != SBORROW8((long)psVar33 - (long)psVar30,uVar17)
            ) != (long)(((long)psVar33 - (long)psVar30) - uVar17) < 0) goto LAB_00118e5f;
LAB_00118d18:
        bVar46 = CARRY8(uVar23,uVar16);
        uVar23 = uVar23 + uVar16;
        psVar33 = (secp256k1_fe *)((long)psVar33->n + bVar46 + uVar24);
        psVar18 = (secp256k1_fe *)((long)psStack_2e0 << 8 | uVar21 >> 0x38);
        uVar16 = uVar21 * 0x100;
        if ((long)uVar21 < 0) goto LAB_00118e64;
        uVar21 = uVar21 * -0x100 - 1;
        lVar34 = (0x7fffffffffffffff - (long)psVar18) - lVar22;
        psVar27 = (secp256k1_fe *)(lVar34 - (ulong)(uVar21 < uVar28));
        if ((SBORROW8(0x7fffffffffffffff - (long)psVar18,lVar22) !=
            SBORROW8(lVar34,(ulong)(uVar21 < uVar28))) != (long)psVar27 < 0) goto LAB_00118e7f;
      }
      else {
        uVar17 = (ulong)((long)psVar30 * -0x100 - 1U < uVar23);
        lVar34 = (0x7fffffffffffffff - uVar24) - (long)psVar33;
        psVar30 = (secp256k1_fe *)(lVar34 - uVar17);
        if ((SBORROW8(0x7fffffffffffffff - uVar24,(long)psVar33) != SBORROW8(lVar34,uVar17)) ==
            (long)psVar30 < 0) goto LAB_00118d18;
LAB_00118e5f:
        psStack_328 = (secp256k1_fe *)0x118e64;
        secp256k1_modinv64_update_de_62_cold_10();
        uVar16 = extraout_RAX_06;
LAB_00118e64:
        lVar38 = (-0x8000000000000000 - (long)psVar18) - (ulong)(uVar16 != 0);
        lVar34 = lVar22 - lVar38;
        uVar21 = lVar34 - (ulong)(uVar28 < -uVar16);
        if ((SBORROW8(lVar22,lVar38) != SBORROW8(lVar34,(ulong)(uVar28 < -uVar16))) !=
            (long)uVar21 < 0) {
LAB_00118e7f:
          psStack_328 = (secp256k1_fe *)0x118e84;
          secp256k1_modinv64_update_de_62_cold_9();
          goto LAB_00118e84;
        }
      }
      psVar27 = psStack_2f8;
      lVar22 = (long)psVar18->n + (ulong)CARRY8(uVar28,uVar16) + lVar22;
      uVar24 = (long)psVar33 << 2 | uVar23 >> 0x3e;
      psStack_2f8->n[3] = uVar23 & 0x3fffffffffffffff;
      psVar44->n[3] = uVar28 + uVar16 & 0x3fffffffffffffff;
      uVar21 = uVar24 + 0x8000000000000000;
      psVar33 = (secp256k1_fe *)
                (((long)psVar33 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar24));
      if (psVar33 != (secp256k1_fe *)0xffffffffffffffff) goto LAB_00118eb6;
      uVar21 = 0xffffffffffffffff;
      uVar16 = uVar28 + uVar16 >> 0x3e | lVar22 * 4;
      psStack_2f8->n[4] = uVar24;
      if ((lVar22 >> 0x3e) + -1 + (ulong)(0x7fffffffffffffff < uVar16) != -1) goto LAB_00118ebb;
      psVar44->n[4] = uVar16;
      psVar30 = (secp256k1_fe *)0x5;
      uVar21 = 0xfffffffffffffffe;
      psStack_328 = (secp256k1_fe *)0x118dc8;
      psVar33 = psStack_2f8;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psStack_2f8,5,
                          &secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar14 < 1) goto LAB_00118ec0;
      uVar21 = 1;
      psVar30 = (secp256k1_fe *)0x5;
      psStack_328 = (secp256k1_fe *)0x118de9;
      psVar33 = psVar27;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar27,5,
                          &secp256k1_const_modinfo_fe.modulus,1);
      if (-1 < iVar14) goto LAB_00118ec5;
      psVar30 = (secp256k1_fe *)0x5;
      uVar21 = 0xfffffffffffffffe;
      psStack_328 = (secp256k1_fe *)0x118e0c;
      psVar33 = psVar44;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar44,5,
                          &secp256k1_const_modinfo_fe.modulus,-2);
      if (iVar14 < 1) goto LAB_00118eca;
      uVar21 = 1;
      psVar30 = (secp256k1_fe *)0x5;
      psStack_328 = (secp256k1_fe *)0x118e2d;
      psVar33 = psVar44;
      iVar14 = secp256k1_modinv64_mul_cmp_62
                         ((secp256k1_modinv64_signed62 *)psVar44,5,
                          &secp256k1_const_modinfo_fe.modulus,1);
      if (iVar14 < 0) {
        return;
      }
      goto LAB_00118ecf;
    }
  }
  iVar14 = (int)psVar30;
  psStack_328 = (secp256k1_fe *)secp256k1_modinv64_mul_cmp_62;
  secp256k1_modinv64_update_de_62_cold_21();
  a_01 = &sStack_388;
  psStack_338 = psVar27;
  psStack_330 = psVar44;
  psStack_328 = psVar18;
  secp256k1_modinv64_mul_62(&sStack_360,(secp256k1_modinv64_signed62 *)psVar33,iVar14,1);
  psVar31 = a_00;
  secp256k1_modinv64_mul_62(&sStack_388,a_00,5,uVar21);
  lVar22 = 0;
  while ((ulong)sStack_360.v[lVar22] < 0x4000000000000000) {
    if (0x3fffffffffffffff < (ulong)sStack_388.v[lVar22]) goto LAB_00118f6e;
    lVar22 = lVar22 + 1;
    if (lVar22 == 4) {
      uVar15 = 4;
      while( true ) {
        if (sStack_360.v[uVar15] < sStack_388.v[uVar15]) {
          return;
        }
        if (sStack_388.v[uVar15] < sStack_360.v[uVar15]) break;
        bVar46 = uVar15 == 0;
        uVar15 = uVar15 - 1;
        if (bVar46) {
          return;
        }
      }
      return;
    }
  }
  secp256k1_modinv64_mul_cmp_62_cold_2();
LAB_00118f6e:
  secp256k1_modinv64_mul_cmp_62_cold_1();
  lVar22 = a_01->v[0];
  uVar21 = a_01->v[1];
  uVar16 = a_01->v[2];
  uVar23 = a_01->v[3];
  lVar34 = a_01->v[4];
  lVar38 = 0;
  do {
    if (a_01->v[lVar38] < -0x3fffffffffffffff) {
      secp256k1_modinv64_normalize_62_cold_7();
LAB_00119198:
      secp256k1_modinv64_normalize_62_cold_6();
      goto LAB_0011919d;
    }
    if (0x3fffffffffffffff < a_01->v[lVar38]) goto LAB_00119198;
    lVar38 = lVar38 + 1;
  } while (lVar38 != 5);
  iVar14 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,-2);
  if (iVar14 < 1) {
LAB_0011919d:
    secp256k1_modinv64_normalize_62_cold_5();
LAB_001191a2:
    secp256k1_modinv64_normalize_62_cold_4();
LAB_001191a7:
    secp256k1_modinv64_normalize_62_cold_3();
  }
  else {
    iVar14 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar14) goto LAB_001191a2;
    uVar24 = lVar34 >> 0x3f;
    uVar45 = (long)psVar31 >> 0x3f;
    uVar28 = (lVar22 + (uVar24 & 0xfffffffefffffc2f) ^ uVar45) - uVar45;
    uVar17 = ((long)uVar28 >> 0x3e) + ((uVar21 ^ uVar45) - uVar45);
    uVar37 = ((long)uVar17 >> 0x3e) + ((uVar16 ^ uVar45) - uVar45);
    uVar39 = ((long)uVar37 >> 0x3e) + ((uVar23 ^ uVar45) - uVar45);
    lVar22 = ((long)uVar39 >> 0x3e) + (((uVar24 & 0x100) + lVar34 ^ uVar45) - uVar45);
    uVar23 = lVar22 >> 0x3f;
    uVar21 = (uVar23 & 0xfffffffefffffc2f) + (uVar28 & 0x3fffffffffffffff);
    uVar16 = ((long)uVar21 >> 0x3e) + (uVar17 & 0x3fffffffffffffff);
    uVar24 = ((long)uVar16 >> 0x3e) + (uVar37 & 0x3fffffffffffffff);
    uVar28 = ((long)uVar24 >> 0x3e) + (uVar39 & 0x3fffffffffffffff);
    uVar23 = ((long)uVar28 >> 0x3e) + (uVar23 & 0x100) + lVar22;
    a_01->v[0] = uVar21 & 0x3fffffffffffffff;
    a_01->v[1] = uVar16 & 0x3fffffffffffffff;
    a_01->v[2] = uVar24 & 0x3fffffffffffffff;
    a_01->v[3] = uVar28 & 0x3fffffffffffffff;
    a_01->v[4] = uVar23;
    if (0x3fffffffffffffff < uVar23) goto LAB_001191a7;
    iVar14 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,0);
    if (-1 < iVar14) {
      iVar14 = secp256k1_modinv64_mul_cmp_62(a_01,5,&secp256k1_const_modinfo_fe.modulus,1);
      if (iVar14 < 0) {
        return;
      }
      goto LAB_001191b1;
    }
  }
  secp256k1_modinv64_normalize_62_cold_2();
LAB_001191b1:
  secp256k1_modinv64_normalize_62_cold_1();
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_cmov(secp256k1_fe *r, const secp256k1_fe *a, int flag) {
    VERIFY_CHECK(flag == 0 || flag == 1);
    SECP256K1_FE_VERIFY(a);
    SECP256K1_FE_VERIFY(r);

    secp256k1_fe_impl_cmov(r, a, flag);
    if (a->magnitude > r->magnitude) r->magnitude = a->magnitude;
    if (!a->normalized) r->normalized = 0;

    SECP256K1_FE_VERIFY(r);
}